

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

HeapBlock * __thiscall Memory::HeapBlockMap64::GetHeapBlock(HeapBlockMap64 *this,void *address)

{
  Node *pNVar1;
  Node *node;
  void *address_local;
  HeapBlockMap64 *this_local;
  
  pNVar1 = FindNode(this,address);
  if (pNVar1 == (Node *)0x0) {
    this_local = (HeapBlockMap64 *)0x0;
  }
  else {
    this_local = (HeapBlockMap64 *)HeapBlockMap32::GetHeapBlock(&pNVar1->map,address);
  }
  return (HeapBlock *)this_local;
}

Assistant:

HeapBlock *
HeapBlockMap64::GetHeapBlock(void * address)
{
    Node * node = FindNode(address);
    if (node == nullptr)
    {
        return nullptr;
    }
    return node->map.GetHeapBlock(address);
}